

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O0

void iadst8_w4_sse2(__m128i *input,__m128i *output)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  uint uVar60;
  int iVar61;
  uint uVar62;
  undefined4 uVar63;
  int32_t *piVar64;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  int iVar65;
  int iVar80;
  int iVar82;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  int iVar66;
  int iVar81;
  int iVar83;
  int iVar84;
  int iVar85;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  __m128i d0_7;
  __m128i c0_7;
  __m128i b0_7;
  __m128i a0_7;
  __m128i v0_7;
  __m128i u0_7;
  __m128i t0_7;
  __m128i d0_6;
  __m128i c0_6;
  __m128i b0_6;
  __m128i a0_6;
  __m128i v0_6;
  __m128i u0_6;
  __m128i t0_6;
  __m128i _in1_7;
  __m128i _in0_7;
  __m128i _in1_6;
  __m128i _in0_6;
  __m128i _in1_5;
  __m128i _in0_5;
  __m128i _in1_4;
  __m128i _in0_4;
  __m128i d0_5;
  __m128i c0_5;
  __m128i b0_5;
  __m128i a0_5;
  __m128i v0_5;
  __m128i u0_5;
  __m128i t0_5;
  __m128i d0_4;
  __m128i c0_4;
  __m128i b0_4;
  __m128i a0_4;
  __m128i v0_4;
  __m128i u0_4;
  __m128i t0_4;
  __m128i _in1_3;
  __m128i _in0_3;
  __m128i _in1_2;
  __m128i _in0_2;
  __m128i _in1_1;
  __m128i _in0_1;
  __m128i _in1;
  __m128i _in0;
  __m128i d0_3;
  __m128i c0_3;
  __m128i b0_3;
  __m128i a0_3;
  __m128i v0_3;
  __m128i u0_3;
  __m128i t0_3;
  __m128i d0_2;
  __m128i c0_2;
  __m128i b0_2;
  __m128i a0_2;
  __m128i v0_2;
  __m128i u0_2;
  __m128i t0_2;
  __m128i d0_1;
  __m128i c0_1;
  __m128i b0_1;
  __m128i a0_1;
  __m128i v0_1;
  __m128i u0_1;
  __m128i t0_1;
  __m128i d0;
  __m128i c0;
  __m128i b0;
  __m128i a0;
  __m128i v0;
  __m128i u0;
  __m128i t0;
  __m128i x [8];
  __m128i cospi_p32_m32;
  __m128i cospi_p32_p32;
  __m128i cospi_m48_p16;
  __m128i cospi_p48_m16;
  __m128i cospi_p16_p48;
  __m128i cospi_p12_m52;
  __m128i cospi_p52_p12;
  __m128i cospi_p28_m36;
  __m128i cospi_p36_p28;
  __m128i cospi_p44_m20;
  __m128i cospi_p20_p44;
  __m128i cospi_p60_m04;
  __m128i cospi_p04_p60;
  __m128i __rounding;
  __m128i __zero;
  int32_t *cospi;
  int8_t cos_bit;
  undefined8 local_f28;
  undefined8 uStack_f20;
  undefined8 local_ef8;
  undefined8 uStack_ef0;
  undefined8 local_ed8;
  undefined8 uStack_ed0;
  undefined8 local_ec8;
  undefined8 uStack_ec0;
  undefined2 local_d58;
  undefined2 uStack_d56;
  undefined2 uStack_d54;
  undefined2 uStack_d52;
  undefined2 local_d48;
  undefined2 uStack_d46;
  undefined2 uStack_d44;
  undefined2 uStack_d42;
  undefined2 local_d38;
  undefined2 uStack_d36;
  undefined2 uStack_d34;
  undefined2 uStack_d32;
  undefined2 local_d28;
  undefined2 uStack_d26;
  undefined2 uStack_d24;
  undefined2 uStack_d22;
  undefined2 local_d18;
  undefined2 uStack_d16;
  undefined2 uStack_d14;
  undefined2 uStack_d12;
  undefined2 local_d08;
  undefined2 uStack_d06;
  undefined2 uStack_d04;
  undefined2 uStack_d02;
  undefined2 local_cf8;
  undefined2 uStack_cf6;
  undefined2 uStack_cf4;
  undefined2 uStack_cf2;
  undefined2 local_ce8;
  undefined2 uStack_ce6;
  undefined2 uStack_ce4;
  undefined2 uStack_ce2;
  undefined2 local_cd8;
  undefined2 uStack_cd6;
  undefined2 uStack_cd4;
  undefined2 uStack_cd2;
  undefined2 local_cc8;
  undefined2 uStack_cc6;
  undefined2 uStack_cc4;
  undefined2 uStack_cc2;
  undefined2 local_cb8;
  undefined2 uStack_cb6;
  undefined2 uStack_cb4;
  undefined2 uStack_cb2;
  undefined2 local_ca8;
  undefined2 uStack_ca6;
  undefined2 uStack_ca4;
  undefined2 uStack_ca2;
  undefined2 local_c98;
  undefined2 uStack_c96;
  undefined2 uStack_c94;
  undefined2 uStack_c92;
  undefined2 local_c88;
  undefined2 uStack_c86;
  undefined2 uStack_c84;
  undefined2 uStack_c82;
  undefined2 local_c78;
  undefined2 uStack_c76;
  undefined2 uStack_c74;
  undefined2 uStack_c72;
  undefined2 local_c68;
  undefined2 uStack_c66;
  undefined2 uStack_c64;
  undefined2 uStack_c62;
  int local_a48;
  int iStack_a44;
  int iStack_a40;
  int iStack_a3c;
  int local_a28;
  int iStack_a24;
  int iStack_a20;
  int iStack_a1c;
  int local_a08;
  int iStack_a04;
  int iStack_a00;
  int iStack_9fc;
  int local_9e8;
  int iStack_9e4;
  int iStack_9e0;
  int iStack_9dc;
  int local_9c8;
  int iStack_9c4;
  int iStack_9c0;
  int iStack_9bc;
  int local_9a8;
  int iStack_9a4;
  int iStack_9a0;
  int iStack_99c;
  int local_988;
  int iStack_984;
  int iStack_980;
  int iStack_97c;
  int local_968;
  int iStack_964;
  int iStack_960;
  int iStack_95c;
  int local_948;
  int iStack_944;
  int iStack_940;
  int iStack_93c;
  int local_928;
  int iStack_924;
  int iStack_920;
  int iStack_91c;
  int local_908;
  int iStack_904;
  int iStack_900;
  int iStack_8fc;
  int local_8e8;
  int iStack_8e4;
  int iStack_8e0;
  int iStack_8dc;
  int local_8c8;
  int iStack_8c4;
  int iStack_8c0;
  int iStack_8bc;
  int local_8a8;
  int iStack_8a4;
  int iStack_8a0;
  int iStack_89c;
  int local_888;
  int iStack_884;
  int iStack_880;
  int iStack_87c;
  int local_868;
  int iStack_864;
  int iStack_860;
  int iStack_85c;
  
  piVar64 = cospi_arr(0xc);
  uVar60 = (uint)*(ushort *)(piVar64 + 4) | piVar64[0x3c] << 0x10;
  auVar26._4_4_ = uVar60;
  auVar26._0_4_ = uVar60;
  auVar26._12_4_ = uVar60;
  auVar26._8_4_ = uVar60;
  iVar61 = (uint)*(ushort *)(piVar64 + 0x3c) + piVar64[4] * -0x10000;
  auVar24._4_4_ = iVar61;
  auVar24._0_4_ = iVar61;
  auVar24._12_4_ = iVar61;
  auVar24._8_4_ = iVar61;
  uVar60 = (uint)*(ushort *)(piVar64 + 0x14) | piVar64[0x2c] << 0x10;
  auVar22._4_4_ = uVar60;
  auVar22._0_4_ = uVar60;
  auVar22._12_4_ = uVar60;
  auVar22._8_4_ = uVar60;
  iVar61 = (uint)*(ushort *)(piVar64 + 0x2c) + piVar64[0x14] * -0x10000;
  auVar20._4_4_ = iVar61;
  auVar20._0_4_ = iVar61;
  auVar20._12_4_ = iVar61;
  auVar20._8_4_ = iVar61;
  uVar60 = (uint)*(ushort *)(piVar64 + 0x24) | piVar64[0x1c] << 0x10;
  auVar18._4_4_ = uVar60;
  auVar18._0_4_ = uVar60;
  auVar18._12_4_ = uVar60;
  auVar18._8_4_ = uVar60;
  iVar61 = (uint)*(ushort *)(piVar64 + 0x1c) + piVar64[0x24] * -0x10000;
  auVar16._4_4_ = iVar61;
  auVar16._0_4_ = iVar61;
  auVar16._12_4_ = iVar61;
  auVar16._8_4_ = iVar61;
  uVar60 = (uint)*(ushort *)(piVar64 + 0x34) | piVar64[0xc] << 0x10;
  auVar14._4_4_ = uVar60;
  auVar14._0_4_ = uVar60;
  auVar14._12_4_ = uVar60;
  auVar14._8_4_ = uVar60;
  iVar61 = (uint)*(ushort *)(piVar64 + 0xc) + piVar64[0x34] * -0x10000;
  auVar75._4_4_ = iVar61;
  auVar75._0_4_ = iVar61;
  auVar75._12_4_ = iVar61;
  auVar75._8_4_ = iVar61;
  uVar60 = (uint)*(ushort *)(piVar64 + 0x10) | piVar64[0x30] << 0x10;
  iVar61 = (uint)*(ushort *)(piVar64 + 0x30) + piVar64[0x10] * -0x10000;
  auVar9._4_4_ = iVar61;
  auVar9._0_4_ = iVar61;
  auVar9._12_4_ = iVar61;
  auVar9._8_4_ = iVar61;
  uVar62 = -piVar64[0x30] & 0xffffU | piVar64[0x10] << 0x10;
  auVar78._4_4_ = uVar62;
  auVar78._0_4_ = uVar62;
  auVar78._12_4_ = uVar62;
  auVar78._8_4_ = uVar62;
  uVar63 = CONCAT22((short)piVar64[0x20],(short)piVar64[0x20]);
  iVar61 = (piVar64[0x20] & 0xffffU) + piVar64[0x20] * -0x10000;
  uVar1 = in_RDI[0xe];
  uVar2 = *in_RDI;
  uVar3 = in_RDI[10];
  uVar4 = in_RDI[4];
  uVar5 = in_RDI[6];
  uVar6 = in_RDI[8];
  uVar7 = in_RDI[2];
  uVar8 = in_RDI[0xc];
  local_c68 = (undefined2)uVar1;
  uStack_c66 = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_c64 = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_c62 = (undefined2)((ulong)uVar1 >> 0x30);
  local_c78 = (undefined2)uVar2;
  uStack_c76 = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_c74 = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_c72 = (undefined2)((ulong)uVar2 >> 0x30);
  auVar27._2_2_ = local_c78;
  auVar27._0_2_ = local_c68;
  auVar27._4_2_ = uStack_c66;
  auVar27._6_2_ = uStack_c76;
  auVar27._10_2_ = uStack_c74;
  auVar27._8_2_ = uStack_c64;
  auVar27._12_2_ = uStack_c62;
  auVar27._14_2_ = uStack_c72;
  auVar67 = pmaddwd(auVar27,auVar26);
  auVar25._2_2_ = local_c78;
  auVar25._0_2_ = local_c68;
  auVar25._4_2_ = uStack_c66;
  auVar25._6_2_ = uStack_c76;
  auVar25._10_2_ = uStack_c74;
  auVar25._8_2_ = uStack_c64;
  auVar25._12_2_ = uStack_c62;
  auVar25._14_2_ = uStack_c72;
  auVar68 = pmaddwd(auVar25,auVar24);
  local_868 = auVar67._0_4_;
  iStack_864 = auVar67._4_4_;
  iStack_860 = auVar67._8_4_;
  iStack_85c = auVar67._12_4_;
  local_888 = auVar68._0_4_;
  iStack_884 = auVar68._4_4_;
  iStack_880 = auVar68._8_4_;
  iStack_87c = auVar68._12_4_;
  auVar67 = ZEXT416(0xc);
  iVar65 = local_868 + 0x800 >> auVar67;
  iVar80 = iStack_864 + 0x800 >> auVar67;
  iVar82 = iStack_860 + 0x800 >> auVar67;
  iVar84 = iStack_85c + 0x800 >> auVar67;
  auVar67 = ZEXT416(0xc);
  iVar66 = local_888 + 0x800 >> auVar67;
  iVar81 = iStack_884 + 0x800 >> auVar67;
  iVar83 = iStack_880 + 0x800 >> auVar67;
  iVar85 = iStack_87c + 0x800 >> auVar67;
  auVar59._4_4_ = iVar80;
  auVar59._0_4_ = iVar65;
  auVar59._12_4_ = iVar84;
  auVar59._8_4_ = iVar82;
  auVar58._4_4_ = iVar80;
  auVar58._0_4_ = iVar65;
  auVar58._12_4_ = iVar84;
  auVar58._8_4_ = iVar82;
  auVar67 = packssdw(auVar59,auVar58);
  auVar57._4_4_ = iVar81;
  auVar57._0_4_ = iVar66;
  auVar57._12_4_ = iVar85;
  auVar57._8_4_ = iVar83;
  auVar56._4_4_ = iVar81;
  auVar56._0_4_ = iVar66;
  auVar56._12_4_ = iVar85;
  auVar56._8_4_ = iVar83;
  auVar68 = packssdw(auVar57,auVar56);
  local_c88 = (undefined2)uVar3;
  uStack_c86 = (undefined2)((ulong)uVar3 >> 0x10);
  uStack_c84 = (undefined2)((ulong)uVar3 >> 0x20);
  uStack_c82 = (undefined2)((ulong)uVar3 >> 0x30);
  local_c98 = (undefined2)uVar4;
  uStack_c96 = (undefined2)((ulong)uVar4 >> 0x10);
  uStack_c94 = (undefined2)((ulong)uVar4 >> 0x20);
  uStack_c92 = (undefined2)((ulong)uVar4 >> 0x30);
  auVar23._2_2_ = local_c98;
  auVar23._0_2_ = local_c88;
  auVar23._4_2_ = uStack_c86;
  auVar23._6_2_ = uStack_c96;
  auVar23._10_2_ = uStack_c94;
  auVar23._8_2_ = uStack_c84;
  auVar23._12_2_ = uStack_c82;
  auVar23._14_2_ = uStack_c92;
  auVar69 = pmaddwd(auVar23,auVar22);
  auVar21._2_2_ = local_c98;
  auVar21._0_2_ = local_c88;
  auVar21._4_2_ = uStack_c86;
  auVar21._6_2_ = uStack_c96;
  auVar21._10_2_ = uStack_c94;
  auVar21._8_2_ = uStack_c84;
  auVar21._12_2_ = uStack_c82;
  auVar21._14_2_ = uStack_c92;
  auVar70 = pmaddwd(auVar21,auVar20);
  local_8a8 = auVar69._0_4_;
  iStack_8a4 = auVar69._4_4_;
  iStack_8a0 = auVar69._8_4_;
  iStack_89c = auVar69._12_4_;
  local_8c8 = auVar70._0_4_;
  iStack_8c4 = auVar70._4_4_;
  iStack_8c0 = auVar70._8_4_;
  iStack_8bc = auVar70._12_4_;
  auVar69 = ZEXT416(0xc);
  iVar65 = local_8a8 + 0x800 >> auVar69;
  iVar80 = iStack_8a4 + 0x800 >> auVar69;
  iVar82 = iStack_8a0 + 0x800 >> auVar69;
  iVar84 = iStack_89c + 0x800 >> auVar69;
  auVar69 = ZEXT416(0xc);
  iVar66 = local_8c8 + 0x800 >> auVar69;
  iVar81 = iStack_8c4 + 0x800 >> auVar69;
  iVar83 = iStack_8c0 + 0x800 >> auVar69;
  iVar85 = iStack_8bc + 0x800 >> auVar69;
  auVar55._4_4_ = iVar80;
  auVar55._0_4_ = iVar65;
  auVar55._12_4_ = iVar84;
  auVar55._8_4_ = iVar82;
  auVar54._4_4_ = iVar80;
  auVar54._0_4_ = iVar65;
  auVar54._12_4_ = iVar84;
  auVar54._8_4_ = iVar82;
  auVar69 = packssdw(auVar55,auVar54);
  auVar53._4_4_ = iVar81;
  auVar53._0_4_ = iVar66;
  auVar53._12_4_ = iVar85;
  auVar53._8_4_ = iVar83;
  auVar52._4_4_ = iVar81;
  auVar52._0_4_ = iVar66;
  auVar52._12_4_ = iVar85;
  auVar52._8_4_ = iVar83;
  auVar70 = packssdw(auVar53,auVar52);
  local_ca8 = (undefined2)uVar5;
  uStack_ca6 = (undefined2)((ulong)uVar5 >> 0x10);
  uStack_ca4 = (undefined2)((ulong)uVar5 >> 0x20);
  uStack_ca2 = (undefined2)((ulong)uVar5 >> 0x30);
  local_cb8 = (undefined2)uVar6;
  uStack_cb6 = (undefined2)((ulong)uVar6 >> 0x10);
  uStack_cb4 = (undefined2)((ulong)uVar6 >> 0x20);
  uStack_cb2 = (undefined2)((ulong)uVar6 >> 0x30);
  auVar19._2_2_ = local_cb8;
  auVar19._0_2_ = local_ca8;
  auVar19._4_2_ = uStack_ca6;
  auVar19._6_2_ = uStack_cb6;
  auVar19._10_2_ = uStack_cb4;
  auVar19._8_2_ = uStack_ca4;
  auVar19._12_2_ = uStack_ca2;
  auVar19._14_2_ = uStack_cb2;
  auVar71 = pmaddwd(auVar19,auVar18);
  auVar17._2_2_ = local_cb8;
  auVar17._0_2_ = local_ca8;
  auVar17._4_2_ = uStack_ca6;
  auVar17._6_2_ = uStack_cb6;
  auVar17._10_2_ = uStack_cb4;
  auVar17._8_2_ = uStack_ca4;
  auVar17._12_2_ = uStack_ca2;
  auVar17._14_2_ = uStack_cb2;
  auVar72 = pmaddwd(auVar17,auVar16);
  local_8e8 = auVar71._0_4_;
  iStack_8e4 = auVar71._4_4_;
  iStack_8e0 = auVar71._8_4_;
  iStack_8dc = auVar71._12_4_;
  local_908 = auVar72._0_4_;
  iStack_904 = auVar72._4_4_;
  iStack_900 = auVar72._8_4_;
  iStack_8fc = auVar72._12_4_;
  auVar71 = ZEXT416(0xc);
  iVar65 = local_8e8 + 0x800 >> auVar71;
  iVar80 = iStack_8e4 + 0x800 >> auVar71;
  iVar82 = iStack_8e0 + 0x800 >> auVar71;
  iVar84 = iStack_8dc + 0x800 >> auVar71;
  auVar71 = ZEXT416(0xc);
  iVar66 = local_908 + 0x800 >> auVar71;
  iVar81 = iStack_904 + 0x800 >> auVar71;
  iVar83 = iStack_900 + 0x800 >> auVar71;
  iVar85 = iStack_8fc + 0x800 >> auVar71;
  auVar51._4_4_ = iVar80;
  auVar51._0_4_ = iVar65;
  auVar51._12_4_ = iVar84;
  auVar51._8_4_ = iVar82;
  auVar50._4_4_ = iVar80;
  auVar50._0_4_ = iVar65;
  auVar50._12_4_ = iVar84;
  auVar50._8_4_ = iVar82;
  auVar71 = packssdw(auVar51,auVar50);
  auVar49._4_4_ = iVar81;
  auVar49._0_4_ = iVar66;
  auVar49._12_4_ = iVar85;
  auVar49._8_4_ = iVar83;
  auVar48._4_4_ = iVar81;
  auVar48._0_4_ = iVar66;
  auVar48._12_4_ = iVar85;
  auVar48._8_4_ = iVar83;
  auVar72 = packssdw(auVar49,auVar48);
  local_cc8 = (undefined2)uVar7;
  uStack_cc6 = (undefined2)((ulong)uVar7 >> 0x10);
  uStack_cc4 = (undefined2)((ulong)uVar7 >> 0x20);
  uStack_cc2 = (undefined2)((ulong)uVar7 >> 0x30);
  local_cd8 = (undefined2)uVar8;
  uStack_cd6 = (undefined2)((ulong)uVar8 >> 0x10);
  uStack_cd4 = (undefined2)((ulong)uVar8 >> 0x20);
  uStack_cd2 = (undefined2)((ulong)uVar8 >> 0x30);
  auVar15._2_2_ = local_cd8;
  auVar15._0_2_ = local_cc8;
  auVar15._4_2_ = uStack_cc6;
  auVar15._6_2_ = uStack_cd6;
  auVar15._10_2_ = uStack_cd4;
  auVar15._8_2_ = uStack_cc4;
  auVar15._12_2_ = uStack_cc2;
  auVar15._14_2_ = uStack_cd2;
  auVar73 = pmaddwd(auVar15,auVar14);
  auVar13._2_2_ = local_cd8;
  auVar13._0_2_ = local_cc8;
  auVar13._4_2_ = uStack_cc6;
  auVar13._6_2_ = uStack_cd6;
  auVar13._10_2_ = uStack_cd4;
  auVar13._8_2_ = uStack_cc4;
  auVar13._12_2_ = uStack_cc2;
  auVar13._14_2_ = uStack_cd2;
  auVar74 = pmaddwd(auVar13,auVar75);
  local_928 = auVar73._0_4_;
  iStack_924 = auVar73._4_4_;
  iStack_920 = auVar73._8_4_;
  iStack_91c = auVar73._12_4_;
  local_948 = auVar74._0_4_;
  iStack_944 = auVar74._4_4_;
  iStack_940 = auVar74._8_4_;
  iStack_93c = auVar74._12_4_;
  auVar73 = ZEXT416(0xc);
  iVar65 = local_928 + 0x800 >> auVar73;
  iVar80 = iStack_924 + 0x800 >> auVar73;
  iVar82 = iStack_920 + 0x800 >> auVar73;
  iVar84 = iStack_91c + 0x800 >> auVar73;
  auVar73 = ZEXT416(0xc);
  iVar66 = local_948 + 0x800 >> auVar73;
  iVar81 = iStack_944 + 0x800 >> auVar73;
  iVar83 = iStack_940 + 0x800 >> auVar73;
  iVar85 = iStack_93c + 0x800 >> auVar73;
  auVar47._4_4_ = iVar80;
  auVar47._0_4_ = iVar65;
  auVar47._12_4_ = iVar84;
  auVar47._8_4_ = iVar82;
  auVar46._4_4_ = iVar80;
  auVar46._0_4_ = iVar65;
  auVar46._12_4_ = iVar84;
  auVar46._8_4_ = iVar82;
  auVar73 = packssdw(auVar47,auVar46);
  auVar45._4_4_ = iVar81;
  auVar45._0_4_ = iVar66;
  auVar45._12_4_ = iVar85;
  auVar45._8_4_ = iVar83;
  auVar44._4_4_ = iVar81;
  auVar44._0_4_ = iVar66;
  auVar44._12_4_ = iVar85;
  auVar44._8_4_ = iVar83;
  auVar74 = packssdw(auVar45,auVar44);
  auVar75 = paddsw(auVar67,auVar71);
  auVar67 = psubsw(auVar67,auVar71);
  auVar71 = paddsw(auVar68,auVar72);
  auVar68 = psubsw(auVar68,auVar72);
  auVar72 = paddsw(auVar69,auVar73);
  auVar69 = psubsw(auVar69,auVar73);
  auVar73 = paddsw(auVar70,auVar74);
  auVar70 = psubsw(auVar70,auVar74);
  local_ce8 = auVar67._0_2_;
  uStack_ce6 = auVar67._2_2_;
  uStack_ce4 = auVar67._4_2_;
  uStack_ce2 = auVar67._6_2_;
  local_cf8 = auVar68._0_2_;
  uStack_cf6 = auVar68._2_2_;
  uStack_cf4 = auVar68._4_2_;
  uStack_cf2 = auVar68._6_2_;
  auVar12._2_2_ = local_cf8;
  auVar12._0_2_ = local_ce8;
  auVar12._4_2_ = uStack_ce6;
  auVar12._6_2_ = uStack_cf6;
  auVar12._10_2_ = uStack_cf4;
  auVar12._8_2_ = uStack_ce4;
  auVar12._12_2_ = uStack_ce2;
  auVar12._14_2_ = uStack_cf2;
  auVar11._8_8_ = CONCAT44(uVar60,uVar60);
  auVar11._0_8_ = CONCAT44(uVar60,uVar60);
  auVar67 = pmaddwd(auVar12,auVar11);
  auVar10._2_2_ = local_cf8;
  auVar10._0_2_ = local_ce8;
  auVar10._4_2_ = uStack_ce6;
  auVar10._6_2_ = uStack_cf6;
  auVar10._10_2_ = uStack_cf4;
  auVar10._8_2_ = uStack_ce4;
  auVar10._12_2_ = uStack_ce2;
  auVar10._14_2_ = uStack_cf2;
  auVar68 = pmaddwd(auVar10,auVar9);
  local_968 = auVar67._0_4_;
  iStack_964 = auVar67._4_4_;
  iStack_960 = auVar67._8_4_;
  iStack_95c = auVar67._12_4_;
  local_988 = auVar68._0_4_;
  iStack_984 = auVar68._4_4_;
  iStack_980 = auVar68._8_4_;
  iStack_97c = auVar68._12_4_;
  auVar67 = ZEXT416(0xc);
  iVar65 = local_968 + 0x800 >> auVar67;
  iVar80 = iStack_964 + 0x800 >> auVar67;
  iVar82 = iStack_960 + 0x800 >> auVar67;
  iVar84 = iStack_95c + 0x800 >> auVar67;
  auVar67 = ZEXT416(0xc);
  iVar66 = local_988 + 0x800 >> auVar67;
  iVar81 = iStack_984 + 0x800 >> auVar67;
  iVar83 = iStack_980 + 0x800 >> auVar67;
  iVar85 = iStack_97c + 0x800 >> auVar67;
  auVar43._4_4_ = iVar80;
  auVar43._0_4_ = iVar65;
  auVar43._12_4_ = iVar84;
  auVar43._8_4_ = iVar82;
  auVar42._4_4_ = iVar80;
  auVar42._0_4_ = iVar65;
  auVar42._12_4_ = iVar84;
  auVar42._8_4_ = iVar82;
  auVar67 = packssdw(auVar43,auVar42);
  auVar41._4_4_ = iVar81;
  auVar41._0_4_ = iVar66;
  auVar41._12_4_ = iVar85;
  auVar41._8_4_ = iVar83;
  auVar40._4_4_ = iVar81;
  auVar40._0_4_ = iVar66;
  auVar40._12_4_ = iVar85;
  auVar40._8_4_ = iVar83;
  auVar68 = packssdw(auVar41,auVar40);
  local_d08 = auVar69._0_2_;
  uStack_d06 = auVar69._2_2_;
  uStack_d04 = auVar69._4_2_;
  uStack_d02 = auVar69._6_2_;
  local_d18 = auVar70._0_2_;
  uStack_d16 = auVar70._2_2_;
  uStack_d14 = auVar70._4_2_;
  uStack_d12 = auVar70._6_2_;
  auVar79._2_2_ = local_d18;
  auVar79._0_2_ = local_d08;
  auVar79._4_2_ = uStack_d06;
  auVar79._6_2_ = uStack_d16;
  auVar79._10_2_ = uStack_d14;
  auVar79._8_2_ = uStack_d04;
  auVar79._12_2_ = uStack_d02;
  auVar79._14_2_ = uStack_d12;
  auVar69 = pmaddwd(auVar79,auVar78);
  auVar77._2_2_ = local_d18;
  auVar77._0_2_ = local_d08;
  auVar77._4_2_ = uStack_d06;
  auVar77._6_2_ = uStack_d16;
  auVar77._10_2_ = uStack_d14;
  auVar77._8_2_ = uStack_d04;
  auVar77._12_2_ = uStack_d02;
  auVar77._14_2_ = uStack_d12;
  auVar76._8_8_ = CONCAT44(uVar60,uVar60);
  auVar76._0_8_ = CONCAT44(uVar60,uVar60);
  auVar70 = pmaddwd(auVar77,auVar76);
  local_9a8 = auVar69._0_4_;
  iStack_9a4 = auVar69._4_4_;
  iStack_9a0 = auVar69._8_4_;
  iStack_99c = auVar69._12_4_;
  local_9c8 = auVar70._0_4_;
  iStack_9c4 = auVar70._4_4_;
  iStack_9c0 = auVar70._8_4_;
  iStack_9bc = auVar70._12_4_;
  auVar69 = ZEXT416(0xc);
  iVar65 = local_9a8 + 0x800 >> auVar69;
  iVar80 = iStack_9a4 + 0x800 >> auVar69;
  iVar82 = iStack_9a0 + 0x800 >> auVar69;
  iVar84 = iStack_99c + 0x800 >> auVar69;
  auVar69 = ZEXT416(0xc);
  iVar66 = local_9c8 + 0x800 >> auVar69;
  iVar81 = iStack_9c4 + 0x800 >> auVar69;
  iVar83 = iStack_9c0 + 0x800 >> auVar69;
  iVar85 = iStack_9bc + 0x800 >> auVar69;
  auVar39._4_4_ = iVar80;
  auVar39._0_4_ = iVar65;
  auVar39._12_4_ = iVar84;
  auVar39._8_4_ = iVar82;
  auVar38._4_4_ = iVar80;
  auVar38._0_4_ = iVar65;
  auVar38._12_4_ = iVar84;
  auVar38._8_4_ = iVar82;
  auVar69 = packssdw(auVar39,auVar38);
  auVar37._4_4_ = iVar81;
  auVar37._0_4_ = iVar66;
  auVar37._12_4_ = iVar85;
  auVar37._8_4_ = iVar83;
  auVar36._4_4_ = iVar81;
  auVar36._0_4_ = iVar66;
  auVar36._12_4_ = iVar85;
  auVar36._8_4_ = iVar83;
  auVar70 = packssdw(auVar37,auVar36);
  auVar76 = paddsw(auVar75,auVar72);
  auVar72 = psubsw(auVar75,auVar72);
  auVar77 = paddsw(auVar71,auVar73);
  auVar71 = psubsw(auVar71,auVar73);
  auVar78 = paddsw(auVar67,auVar69);
  auVar67 = psubsw(auVar67,auVar69);
  auVar79 = paddsw(auVar68,auVar70);
  auVar68 = psubsw(auVar68,auVar70);
  local_d28 = auVar72._0_2_;
  uStack_d26 = auVar72._2_2_;
  uStack_d24 = auVar72._4_2_;
  uStack_d22 = auVar72._6_2_;
  local_d38 = auVar71._0_2_;
  uStack_d36 = auVar71._2_2_;
  uStack_d34 = auVar71._4_2_;
  uStack_d32 = auVar71._6_2_;
  auVar74._2_2_ = local_d38;
  auVar74._0_2_ = local_d28;
  auVar74._4_2_ = uStack_d26;
  auVar74._6_2_ = uStack_d36;
  auVar74._10_2_ = uStack_d34;
  auVar74._8_2_ = uStack_d24;
  auVar74._12_2_ = uStack_d22;
  auVar74._14_2_ = uStack_d32;
  auVar73._8_8_ = CONCAT44(uVar63,uVar63);
  auVar73._0_8_ = CONCAT44(uVar63,uVar63);
  auVar69 = pmaddwd(auVar74,auVar73);
  auVar72._2_2_ = local_d38;
  auVar72._0_2_ = local_d28;
  auVar72._4_2_ = uStack_d26;
  auVar72._6_2_ = uStack_d36;
  auVar72._10_2_ = uStack_d34;
  auVar72._8_2_ = uStack_d24;
  auVar72._12_2_ = uStack_d22;
  auVar72._14_2_ = uStack_d32;
  auVar71._8_8_ = CONCAT44(iVar61,iVar61);
  auVar71._0_8_ = CONCAT44(iVar61,iVar61);
  auVar70 = pmaddwd(auVar72,auVar71);
  local_9e8 = auVar69._0_4_;
  iStack_9e4 = auVar69._4_4_;
  iStack_9e0 = auVar69._8_4_;
  iStack_9dc = auVar69._12_4_;
  local_a08 = auVar70._0_4_;
  iStack_a04 = auVar70._4_4_;
  iStack_a00 = auVar70._8_4_;
  iStack_9fc = auVar70._12_4_;
  auVar69 = ZEXT416(0xc);
  iVar65 = local_9e8 + 0x800 >> auVar69;
  iVar80 = iStack_9e4 + 0x800 >> auVar69;
  iVar82 = iStack_9e0 + 0x800 >> auVar69;
  iVar84 = iStack_9dc + 0x800 >> auVar69;
  auVar69 = ZEXT416(0xc);
  iVar66 = local_a08 + 0x800 >> auVar69;
  iVar81 = iStack_a04 + 0x800 >> auVar69;
  iVar83 = iStack_a00 + 0x800 >> auVar69;
  iVar85 = iStack_9fc + 0x800 >> auVar69;
  auVar35._4_4_ = iVar80;
  auVar35._0_4_ = iVar65;
  auVar35._12_4_ = iVar84;
  auVar35._8_4_ = iVar82;
  auVar34._4_4_ = iVar80;
  auVar34._0_4_ = iVar65;
  auVar34._12_4_ = iVar84;
  auVar34._8_4_ = iVar82;
  auVar71 = packssdw(auVar35,auVar34);
  auVar33._4_4_ = iVar81;
  auVar33._0_4_ = iVar66;
  auVar33._12_4_ = iVar85;
  auVar33._8_4_ = iVar83;
  auVar32._4_4_ = iVar81;
  auVar32._0_4_ = iVar66;
  auVar32._12_4_ = iVar85;
  auVar32._8_4_ = iVar83;
  auVar72 = packssdw(auVar33,auVar32);
  local_d48 = auVar67._0_2_;
  uStack_d46 = auVar67._2_2_;
  uStack_d44 = auVar67._4_2_;
  uStack_d42 = auVar67._6_2_;
  local_d58 = auVar68._0_2_;
  uStack_d56 = auVar68._2_2_;
  uStack_d54 = auVar68._4_2_;
  uStack_d52 = auVar68._6_2_;
  auVar70._2_2_ = local_d58;
  auVar70._0_2_ = local_d48;
  auVar70._4_2_ = uStack_d46;
  auVar70._6_2_ = uStack_d56;
  auVar70._10_2_ = uStack_d54;
  auVar70._8_2_ = uStack_d44;
  auVar70._12_2_ = uStack_d42;
  auVar70._14_2_ = uStack_d52;
  auVar69._8_8_ = CONCAT44(uVar63,uVar63);
  auVar69._0_8_ = CONCAT44(uVar63,uVar63);
  auVar69 = pmaddwd(auVar70,auVar69);
  auVar68._2_2_ = local_d58;
  auVar68._0_2_ = local_d48;
  auVar68._4_2_ = uStack_d46;
  auVar68._6_2_ = uStack_d56;
  auVar68._10_2_ = uStack_d54;
  auVar68._8_2_ = uStack_d44;
  auVar68._12_2_ = uStack_d42;
  auVar68._14_2_ = uStack_d52;
  auVar67._8_8_ = CONCAT44(iVar61,iVar61);
  auVar67._0_8_ = CONCAT44(iVar61,iVar61);
  auVar67 = pmaddwd(auVar68,auVar67);
  local_a28 = auVar69._0_4_;
  iStack_a24 = auVar69._4_4_;
  iStack_a20 = auVar69._8_4_;
  iStack_a1c = auVar69._12_4_;
  local_a48 = auVar67._0_4_;
  iStack_a44 = auVar67._4_4_;
  iStack_a40 = auVar67._8_4_;
  iStack_a3c = auVar67._12_4_;
  auVar67 = ZEXT416(0xc);
  iVar61 = local_a28 + 0x800 >> auVar67;
  iVar66 = iStack_a24 + 0x800 >> auVar67;
  iVar81 = iStack_a20 + 0x800 >> auVar67;
  iVar83 = iStack_a1c + 0x800 >> auVar67;
  auVar67 = ZEXT416(0xc);
  iVar65 = local_a48 + 0x800 >> auVar67;
  iVar80 = iStack_a44 + 0x800 >> auVar67;
  iVar82 = iStack_a40 + 0x800 >> auVar67;
  iVar84 = iStack_a3c + 0x800 >> auVar67;
  auVar31._4_4_ = iVar66;
  auVar31._0_4_ = iVar61;
  auVar31._12_4_ = iVar83;
  auVar31._8_4_ = iVar81;
  auVar30._4_4_ = iVar66;
  auVar30._0_4_ = iVar61;
  auVar30._12_4_ = iVar83;
  auVar30._8_4_ = iVar81;
  auVar67 = packssdw(auVar31,auVar30);
  auVar29._4_4_ = iVar80;
  auVar29._0_4_ = iVar65;
  auVar29._12_4_ = iVar84;
  auVar29._8_4_ = iVar82;
  auVar28._4_4_ = iVar80;
  auVar28._0_4_ = iVar65;
  auVar28._12_4_ = iVar84;
  auVar28._8_4_ = iVar82;
  auVar68 = packssdw(auVar29,auVar28);
  local_f28 = auVar76._0_8_;
  uStack_f20 = auVar76._8_8_;
  *in_RSI = local_f28;
  in_RSI[1] = uStack_f20;
  auVar69 = psubsw(ZEXT816(0),auVar78);
  *(undefined1 (*) [16])(in_RSI + 2) = auVar69;
  local_ec8 = auVar67._0_8_;
  uStack_ec0 = auVar67._8_8_;
  in_RSI[4] = local_ec8;
  in_RSI[5] = uStack_ec0;
  auVar67 = psubsw(ZEXT816(0),auVar71);
  *(undefined1 (*) [16])(in_RSI + 6) = auVar67;
  local_ef8 = auVar72._0_8_;
  uStack_ef0 = auVar72._8_8_;
  in_RSI[8] = local_ef8;
  in_RSI[9] = uStack_ef0;
  auVar67 = psubsw(ZEXT816(0),auVar68);
  *(undefined1 (*) [16])(in_RSI + 10) = auVar67;
  local_ed8 = auVar79._0_8_;
  uStack_ed0 = auVar79._8_8_;
  in_RSI[0xc] = local_ed8;
  in_RSI[0xd] = uStack_ed0;
  auVar67 = psubsw(ZEXT816(0),auVar77);
  *(undefined1 (*) [16])(in_RSI + 0xe) = auVar67;
  return;
}

Assistant:

static void iadst8_w4_sse2(const __m128i *input, __m128i *output) {
  const int8_t cos_bit = INV_COS_BIT;
  const int32_t *cospi = cospi_arr(INV_COS_BIT);
  const __m128i __zero = _mm_setzero_si128();
  const __m128i __rounding = _mm_set1_epi32(1 << (INV_COS_BIT - 1));

  const __m128i cospi_p04_p60 = pair_set_epi16(cospi[4], cospi[60]);
  const __m128i cospi_p60_m04 = pair_set_epi16(cospi[60], -cospi[4]);
  const __m128i cospi_p20_p44 = pair_set_epi16(cospi[20], cospi[44]);
  const __m128i cospi_p44_m20 = pair_set_epi16(cospi[44], -cospi[20]);
  const __m128i cospi_p36_p28 = pair_set_epi16(cospi[36], cospi[28]);
  const __m128i cospi_p28_m36 = pair_set_epi16(cospi[28], -cospi[36]);
  const __m128i cospi_p52_p12 = pair_set_epi16(cospi[52], cospi[12]);
  const __m128i cospi_p12_m52 = pair_set_epi16(cospi[12], -cospi[52]);
  const __m128i cospi_p16_p48 = pair_set_epi16(cospi[16], cospi[48]);
  const __m128i cospi_p48_m16 = pair_set_epi16(cospi[48], -cospi[16]);
  const __m128i cospi_m48_p16 = pair_set_epi16(-cospi[48], cospi[16]);
  const __m128i cospi_p32_p32 = pair_set_epi16(cospi[32], cospi[32]);
  const __m128i cospi_p32_m32 = pair_set_epi16(cospi[32], -cospi[32]);

  // stage 1
  __m128i x[8];
  x[0] = input[7];
  x[1] = input[0];
  x[2] = input[5];
  x[3] = input[2];
  x[4] = input[3];
  x[5] = input[4];
  x[6] = input[1];
  x[7] = input[6];

  // stage 2
  btf_16_4p_sse2(cospi_p04_p60, cospi_p60_m04, x[0], x[1], x[0], x[1]);
  btf_16_4p_sse2(cospi_p20_p44, cospi_p44_m20, x[2], x[3], x[2], x[3]);
  btf_16_4p_sse2(cospi_p36_p28, cospi_p28_m36, x[4], x[5], x[4], x[5]);
  btf_16_4p_sse2(cospi_p52_p12, cospi_p12_m52, x[6], x[7], x[6], x[7]);

  // stage 3
  btf_16_adds_subs_sse2(x[0], x[4]);
  btf_16_adds_subs_sse2(x[1], x[5]);
  btf_16_adds_subs_sse2(x[2], x[6]);
  btf_16_adds_subs_sse2(x[3], x[7]);

  // stage 4
  btf_16_4p_sse2(cospi_p16_p48, cospi_p48_m16, x[4], x[5], x[4], x[5]);
  btf_16_4p_sse2(cospi_m48_p16, cospi_p16_p48, x[6], x[7], x[6], x[7]);

  // stage 5
  btf_16_adds_subs_sse2(x[0], x[2]);
  btf_16_adds_subs_sse2(x[1], x[3]);
  btf_16_adds_subs_sse2(x[4], x[6]);
  btf_16_adds_subs_sse2(x[5], x[7]);

  // stage 6
  btf_16_4p_sse2(cospi_p32_p32, cospi_p32_m32, x[2], x[3], x[2], x[3]);
  btf_16_4p_sse2(cospi_p32_p32, cospi_p32_m32, x[6], x[7], x[6], x[7]);

  // stage 7
  output[0] = x[0];
  output[1] = _mm_subs_epi16(__zero, x[4]);
  output[2] = x[6];
  output[3] = _mm_subs_epi16(__zero, x[2]);
  output[4] = x[3];
  output[5] = _mm_subs_epi16(__zero, x[7]);
  output[6] = x[5];
  output[7] = _mm_subs_epi16(__zero, x[1]);
}